

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::upperword(Forth *this)

{
  char __c;
  uint uVar1;
  int iVar2;
  Cell CVar3;
  Cell CVar4;
  size_type sVar5;
  reference pvVar6;
  char *src;
  bool bVar7;
  allocator<char> local_69;
  string local_68;
  byte local_46;
  byte local_45;
  Char currentChar_1;
  Char currentChar;
  undefined1 local_38 [8];
  string wordBuffer;
  char delim;
  Forth *this_local;
  
  requireDStackDepth(this,1,"UPPERWORD");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  wordBuffer.field_2._M_local_buf[0xf] = (char)uVar1;
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,'\0');
  iVar2 = getSourceBufferRemain(this);
  if (0 < iVar2) {
    CVar3 = getSourceAddress(this);
    CVar4 = getSourceBufferOffset(this);
    local_45 = getDataChar(this,CVar3 + CVar4);
    while( true ) {
      iVar2 = getSourceBufferRemain(this);
      bVar7 = false;
      if (((0 < iVar2) &&
          (bVar7 = true, (uint)local_45 != (int)wordBuffer.field_2._M_local_buf[0xf])) &&
         (bVar7 = false, wordBuffer.field_2._M_local_buf[0xf] == ' ')) {
        iVar2 = isspace((uint)local_45);
        bVar7 = iVar2 != 0;
      }
      if (!bVar7) break;
      incSourceBufferOffset(this);
      CVar3 = getSourceAddress(this);
      CVar4 = getSourceBufferOffset(this);
      local_45 = getDataChar(this,CVar3 + CVar4);
    }
  }
  iVar2 = getSourceBufferRemain(this);
  if (0 < iVar2) {
    while (iVar2 = getSourceBufferRemain(this), 0 < iVar2) {
      CVar3 = getSourceAddress(this);
      CVar4 = getSourceBufferOffset(this);
      local_46 = getDataChar(this,CVar3 + CVar4);
      if (((uint)local_46 == (int)wordBuffer.field_2._M_local_buf[0xf]) ||
         ((wordBuffer.field_2._M_local_buf[0xf] == ' ' &&
          (iVar2 = isspace((uint)local_46), iVar2 != 0)))) break;
      __c = toupper_ascii(local_46);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__c);
      incSourceBufferOffset(this);
    }
    iVar2 = getSourceBufferRemain(this);
    if (0 < iVar2) {
      incSourceBufferOffset(this);
    }
  }
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  if (sVar5 < 0x100) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38,0);
    *pvVar6 = (char)sVar5 + -1;
    CVar3 = this->VarOffsetWordBuffer;
    src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
    moveIntoDataSpace(this,CVar3,src,sVar5);
    ForthStack<unsigned_int>::setTop(&this->dStack,this->VarOffsetWordBuffer);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"WORD: very long word ",&local_69);
    throwMessage(this,&local_68,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void  upperword() {
			REQUIRE_DSTACK_DEPTH(1, "UPPERWORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			
				// Skip leading delimiters
				if (getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					while (getSourceBufferRemain() > 0 && ((currentChar == delim)
						|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
						)) {
						incSourceBufferOffset();
						currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					}
				}
				if (getSourceBufferRemain() > 0) {
					// Copy characters until we see the delimiter again.
					while (getSourceBufferRemain() >0 ) {
						auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
						if( currentChar != delim
						&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
						) {
						wordBuffer.push_back(toupper_ascii(static_cast<unsigned char>(currentChar)));
						incSourceBufferOffset();
						} else {
							break;
						}
					}
					// source point to the delimiter char, skip it.
					if (getSourceBufferRemain() >0 ) {
						incSourceBufferOffset(); 
					}
				}
				if (wordBuffer.size() > 255){
					// @bug it is catched below
					throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
					return;
				}
				// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));
		}